

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

int * WM_Mix(midi *handle,int *buffer,unsigned_long count)

{
  unsigned_long count_local;
  int *buffer_local;
  midi *handle_local;
  
  if ((*(ushort *)((long)handle + 0x30) & 2) == 0) {
    handle_local = WM_Mix_Linear(handle,buffer,count);
  }
  else {
    handle_local = WM_Mix_Gauss(handle,buffer,count);
  }
  return (int *)handle_local;
}

Assistant:

int *WM_Mix(midi *handle, int *buffer, unsigned long count)
{
	if (((struct _mdi *)handle)->info.mixer_options & WM_MO_ENHANCED_RESAMPLING)
	{
		return WM_Mix_Gauss(handle, buffer, count);
	}
	else
	{
		return WM_Mix_Linear(handle, buffer, count);
	}
}